

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::MeshLoader::loadTexCoordsSourceElement(MeshLoader *this,InputShared *input)

{
  MeshLoader *pMVar1;
  Semantic *pSVar2;
  SourceBase *sourceBase;
  String *pSVar3;
  ostream *poVar4;
  MeshLoader *this_00;
  MeshLoader *pMVar5;
  URI *copyFrom_;
  bool bVar6;
  Semantic semantic;
  String sourceId;
  URI inputUrl;
  Semantic local_13c;
  String local_138;
  URI local_118;
  
  local_13c = (input->super_InputUnshared).mSemantic;
  if ((local_13c != TEXCOORD) && (local_13c != UV)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The current input element is not a UV / TEXCOORD element!",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    return false;
  }
  copyFrom_ = &(input->super_InputUnshared).mSource;
  COLLADABU::URI::URI(&local_118,copyFrom_,false);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_118.mFragment._M_dataplus._M_p,
             local_118.mFragment._M_dataplus._M_p + local_118.mFragment._M_string_length);
  this_00 = this;
  sourceBase = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_138);
  if (sourceBase != (SourceBase *)0x0) {
    pMVar1 = (MeshLoader *)(sourceBase->mLoadedInputElements).mCount;
    bVar6 = pMVar1 != (MeshLoader *)0x0;
    if (bVar6) {
      pSVar2 = (sourceBase->mLoadedInputElements).mData;
      if (*pSVar2 == local_13c) goto LAB_00827851;
      this_00 = (MeshLoader *)0x1;
      do {
        pMVar5 = this_00;
        this_00 = pMVar5;
        if (pMVar1 == pMVar5) break;
        this_00 = (MeshLoader *)
                  ((long)&(pMVar5->super_SourceArrayLoader).super_FilePartLoader.
                          super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader + 1);
      } while (pSVar2[(long)pMVar5] != local_13c);
      bVar6 = pMVar5 < pMVar1;
    }
    if (!bVar6) {
      if (sourceBase->mStride - 5 < 0xfffffffffffffffd) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"The uv source ",0xe);
        pSVar3 = COLLADABU::URI::getURIString_abi_cxx11_(copyFrom_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(pSVar3->_M_dataplus)._M_p,
                            pSVar3->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," has a wrong dimension of ",0x1a)
        ;
        poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,". Dimensions between 2 and 4 are allowed. ",0x2a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        bVar6 = false;
      }
      else {
        bVar6 = appendVertexValues(this_00,sourceBase,&this->mMesh->mUVCoords);
      }
      SourceBase::addLoadedInputElement(sourceBase,&local_13c);
      goto LAB_0082796e;
    }
  }
LAB_00827851:
  bVar6 = false;
LAB_0082796e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  COLLADABU::URI::~URI(&local_118);
  return bVar6;
}

Assistant:

bool MeshLoader::loadTexCoordsSourceElement ( const InputShared& input )
    {
        bool retValue = true;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        if ( semantic != InputSemantic::UV && semantic != InputSemantic::TEXCOORD )
        {
            std::cerr << "The current input element is not a UV / TEXCOORD element!" << std::endl;
            return false;
        }

        // Get the source element with the uri of the input element.
        COLLADABU::URI inputUrl = input.getSource ();
        String sourceId = inputUrl.getFragment ();
        SourceBase* sourceBase = getSourceById ( sourceId );
        if ( sourceBase == 0 ) return false;

        // Check if the source element is already loaded.
        if ( sourceBase->isLoadedInputElement ( semantic ) ) return false;

        // Get the stride of the uv coordinates. 
        // This is the dimension of the uv coordinates.
        // In depend on the dimension, we store the coordinates in the mesh.
        unsigned long long stride = sourceBase->getStride ();
        if ( stride < 2 || stride > 4 )
        {
            std::cerr << "The uv source " <<  input.getSource().getURIString () 
                << " has a wrong dimension of " << stride 
                << ". Dimensions between 2 and 4 are allowed. " << std::endl;
            retValue = false;
        }
        else
        {
            COLLADAFW::MeshVertexData& uvCoords = mMesh->getUVCoords ();
            retValue = appendVertexValues ( sourceBase, uvCoords );
        }

        // Set the source base as loaded element.
        sourceBase->addLoadedInputElement ( semantic );

        return retValue;
    }